

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

size_t coda_revnspc(char *s,char *n,size_t len)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  
  lVar1 = len - 1;
  lVar3 = lVar1;
  if (0 < (long)len) {
    do {
      if (*n != '\0') {
        pcVar4 = n + 1;
        cVar5 = *n;
        do {
          if (s[lVar3] == cVar5) goto LAB_001056e2;
          cVar5 = *pcVar4;
          pcVar4 = pcVar4 + 1;
        } while (cVar5 != '\0');
      }
      bVar2 = 0 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
    lVar3 = -1;
  }
LAB_001056e2:
  return lVar1 - lVar3;
}

Assistant:

size_t coda_revnspc(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x;

	for (; p > b; --p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) return s - 1 + len - p;
		}
	}

	return s - 1 + len - p;
}